

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall TcpSocketImpl::WriteThread(TcpSocketImpl *this)

{
  atomic_uchar *paVar1;
  _Elt_pointer ptVar2;
  _Head_base<1UL,_unsigned_long,_false> __n;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
  *this_00;
  uint __i;
  int iVar3;
  long lVar4;
  ulong uVar5;
  size_type sVar6;
  ssize_t sVar7;
  id iVar8;
  int *piVar9;
  unsigned_long __n2_1;
  long *plVar10;
  unsigned_long __n2;
  bool bVar11;
  thread thErrorCb;
  _Head_base<1UL,_unsigned_long,_false> local_188;
  _Head_base<0UL,_unsigned_char_*,_false> _Stack_180;
  pthread_mutex_t *local_178;
  socklen_t iLen;
  undefined4 uStack_16c;
  int *local_168;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
  *local_160;
  unique_lock<std::mutex> lock;
  timeval local_148;
  fd_set errorfd;
  fd_set writefd;
  
  LOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  (paVar1->super___atomic_base<unsigned_char>)._M_i =
       (paVar1->super___atomic_base<unsigned_char>)._M_i & 0xfd;
  UNLOCK();
  std::unique_lock<std::mutex>::unique_lock(&lock,&(this->super_BaseSocketImpl).m_mxWrite);
  local_178 = (pthread_mutex_t *)&this->m_mxOutDeque;
  local_160 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
               *)&this->m_quOutData;
  local_168 = &(this->super_BaseSocketImpl).m_iError;
LAB_0011556a:
  do {
    if (this->m_bCloseReq == false) {
LAB_0011558c:
      if ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0) {
        while (((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0 &&
               (this->m_bCloseReq == false))) {
          std::condition_variable::wait((unique_lock *)&this->m_cv);
        }
      }
    }
    else {
      if ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0) goto LAB_001159d0;
      if (this->m_bCloseReq == false) goto LAB_0011558c;
    }
    if ((this->super_BaseSocketImpl).m_fSock == -1) goto LAB_001159d0;
    if ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i != 0) {
      writefd.fds_bits[0xe] = 0;
      writefd.fds_bits[0xf] = 0;
      writefd.fds_bits[0xc] = 0;
      writefd.fds_bits[0xd] = 0;
      writefd.fds_bits[10] = 0;
      writefd.fds_bits[0xb] = 0;
      writefd.fds_bits[8] = 0;
      writefd.fds_bits[9] = 0;
      writefd.fds_bits[6] = 0;
      writefd.fds_bits[7] = 0;
      writefd.fds_bits[4] = 0;
      writefd.fds_bits[5] = 0;
      writefd.fds_bits[2] = 0;
      writefd.fds_bits[3] = 0;
      writefd.fds_bits[0] = 0;
      writefd.fds_bits[1] = 0;
      errorfd.fds_bits[0xe] = 0;
      errorfd.fds_bits[0xf] = 0;
      errorfd.fds_bits[0xc] = 0;
      errorfd.fds_bits[0xd] = 0;
      errorfd.fds_bits[10] = 0;
      errorfd.fds_bits[0xb] = 0;
      errorfd.fds_bits[8] = 0;
      errorfd.fds_bits[9] = 0;
      errorfd.fds_bits[6] = 0;
      errorfd.fds_bits[7] = 0;
      errorfd.fds_bits[4] = 0;
      errorfd.fds_bits[5] = 0;
      errorfd.fds_bits[2] = 0;
      errorfd.fds_bits[3] = 0;
      errorfd.fds_bits[0] = 0;
      errorfd.fds_bits[1] = 0;
      local_148.tv_sec = 1;
      local_148.tv_usec = 0;
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        writefd.fds_bits[lVar4] = 0;
      }
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        errorfd.fds_bits[lVar4] = 0;
      }
      iVar3 = (this->super_BaseSocketImpl).m_fSock;
      uVar5 = 1L << ((byte)iVar3 & 0x3f);
      writefd.fds_bits[iVar3 / 0x40] = writefd.fds_bits[iVar3 / 0x40] | uVar5;
      errorfd.fds_bits[iVar3 / 0x40] = errorfd.fds_bits[iVar3 / 0x40] | uVar5;
      iVar3 = select(iVar3 + 1,(fd_set *)0x0,(fd_set *)&writefd,(fd_set *)&errorfd,&local_148);
      if (iVar3 == 0) {
        if (this->m_bCloseReq != false) {
LAB_001159d0:
          std::unique_lock<std::mutex>::unlock(&lock);
          if (((*local_168 == 0) && (iVar3 = (this->super_BaseSocketImpl).m_fSock, iVar3 != -1)) &&
             (iVar3 = shutdown(iVar3,1), iVar3 != 0)) {
            piVar9 = __errno_location();
            (this->super_BaseSocketImpl).m_iError = *piVar9;
            (this->super_BaseSocketImpl).m_iErrLoc = 4;
          }
          LOCK();
          paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
          (paVar1->super___atomic_base<unsigned_char>)._M_i =
               (paVar1->super___atomic_base<unsigned_char>)._M_i | 2;
          UNLOCK();
          paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
          LOCK();
          bVar11 = (paVar1->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (bVar11) {
            (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
          if (bVar11) {
            iVar3 = (this->super_BaseSocketImpl).m_fSock;
            if (iVar3 != -1) {
              close(iVar3);
              (this->super_BaseSocketImpl).m_fSock = -1;
            }
            (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
            if ((this->m_pRefServSocket != (TcpServer *)0x0) || (this->m_bSelfDelete == true)) {
              (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x16])(this);
            }
          }
          std::unique_lock<std::mutex>::~unique_lock(&lock);
          return;
        }
      }
      else {
        iVar3 = (this->super_BaseSocketImpl).m_fSock;
        if (((ulong)errorfd.fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) != 0) {
          if (*local_168 == 0) {
            iLen = 4;
            getsockopt(iVar3,1,4,local_168,&iLen);
            (this->super_BaseSocketImpl).m_iErrLoc = 2;
            std::unique_lock<std::mutex>::unlock(&lock);
            thErrorCb._M_id._M_thread = (id)0;
            local_188._M_head_impl = (unsigned_long)operator_new(0x10);
            *(undefined ***)local_188._M_head_impl = &PTR___State_001456c8;
            *(TcpSocketImpl **)(local_188._M_head_impl + 8) = this;
            std::thread::_M_start_thread(&thErrorCb,&local_188,0);
            if ((long *)local_188._M_head_impl != (long *)0x0) {
              (**(code **)(*(long *)local_188._M_head_impl + 8))();
            }
            std::thread::join();
            std::unique_lock<std::mutex>::lock(&lock);
            std::thread::~thread(&thErrorCb);
          }
          goto LAB_001159d0;
        }
        std::mutex::lock((mutex *)&local_178->__data);
        this_00 = local_160;
        sVar6 = std::
                deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                ::size((deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                        *)local_160);
        if (sVar6 != 0) {
          ptVar2 = (this->m_quOutData).
                   super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_188._M_head_impl =
               (ptVar2->
               super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
               ).super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
               _M_head_impl;
          _Stack_180._M_head_impl =
               (ptVar2->
               super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
               ).
               super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
               ._M_head_impl._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          (ptVar2->
          super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
          ).
          super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
          ._M_head_impl._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false> =
               (_Head_base<0UL,_unsigned_char_*,_false>)0x0;
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
          ::pop_front((deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                       *)this_00);
          LOCK();
          (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
               (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i - local_188._M_head_impl
          ;
          UNLOCK();
          pthread_mutex_unlock(local_178);
          sVar7 = send((this->super_BaseSocketImpl).m_fSock,_Stack_180._M_head_impl,
                       (long)(int)local_188._M_head_impl,0);
          if ((int)(uint)sVar7 < 1) {
            piVar9 = __errno_location();
            __n._M_head_impl = local_188._M_head_impl;
            if (*piVar9 != 0xb) {
              (this->super_BaseSocketImpl).m_iError = *piVar9;
              (this->super_BaseSocketImpl).m_iErrLoc = 3;
              std::unique_lock<std::mutex>::unlock(&lock);
              _iLen = (id)0;
              thErrorCb._M_id._M_thread = (id)operator_new(0x10);
              *(undefined ***)thErrorCb._M_id._M_thread = &PTR___State_00145708;
              *(TcpSocketImpl **)((long)thErrorCb._M_id._M_thread + 8) = this;
              std::thread::_M_start_thread(&iLen,&thErrorCb,0);
              if (thErrorCb._M_id._M_thread != 0) {
                (**(code **)(*(long *)thErrorCb._M_id._M_thread + 8))();
              }
              std::thread::join();
              std::unique_lock<std::mutex>::lock(&lock);
              std::thread::~thread((thread *)&iLen);
              std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                        ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         &_Stack_180);
              goto LAB_001159d0;
            }
            iVar8._M_thread = (native_handle_type)operator_new__(local_188._M_head_impl);
            memset((void *)iVar8._M_thread,0,__n._M_head_impl);
            thErrorCb._M_id._M_thread = (id)(id)iVar8._M_thread;
            if ((long *)__n._M_head_impl != (long *)0x0) {
              memmove((void *)iVar8._M_thread,_Stack_180._M_head_impl,__n._M_head_impl);
            }
            std::mutex::lock((mutex *)&local_178->__data);
            LOCK();
            (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
                 (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i +
                 local_188._M_head_impl;
            UNLOCK();
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
            ::
            emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                      (local_160,
                       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       &thErrorCb,&local_188._M_head_impl);
LAB_0011588a:
            pthread_mutex_unlock(local_178);
            std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                      ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       &thErrorCb);
          }
          else {
            plVar10 = (long *)(ulong)((uint)sVar7 & 0x7fffffff);
            uVar5 = local_188._M_head_impl - (long)plVar10;
            if (plVar10 <= local_188._M_head_impl && uVar5 != 0) {
              iVar8._M_thread = (native_handle_type)operator_new__(uVar5);
              memset((void *)iVar8._M_thread,0,uVar5);
              thErrorCb._M_id._M_thread = (id)(id)iVar8._M_thread;
              memmove((void *)iVar8._M_thread,_Stack_180._M_head_impl + (long)plVar10,uVar5);
              std::mutex::lock((mutex *)&local_178->__data);
              LOCK();
              (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
                   local_188._M_head_impl +
                   ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i - (long)plVar10);
              UNLOCK();
              _iLen = (id)(local_188._M_head_impl - (long)plVar10);
              std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
              ::
              emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>
                        (local_160,
                         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         &thErrorCb,(unsigned_long *)&iLen);
              goto LAB_0011588a;
            }
          }
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                     &_Stack_180);
          goto LAB_001158a6;
        }
        LOCK();
        (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        pthread_mutex_unlock(local_178);
      }
      goto LAB_0011556a;
    }
LAB_001158a6:
    if (*local_168 != 0) goto LAB_001159d0;
  } while( true );
}

Assistant:

void TcpSocketImpl::WriteThread()
{
    m_iShutDownState &= static_cast<uint8_t>(~2);

    unique_lock<mutex> lock(m_mxWrite);

    while (m_bCloseReq == false || m_atOutBytes != 0)
    {
        if (m_bCloseReq == false && m_atOutBytes == 0)
            m_cv.wait(lock, [&]() noexcept { return m_atOutBytes == 0 ? m_bCloseReq : true; });

        if (m_fSock == INVALID_SOCKET)
            break;

        if (m_atOutBytes != 0)
        {
            fd_set writefd{}, errorfd{};
            struct timeval timeout{};

            timeout.tv_sec = 1;
            timeout.tv_usec = 0;
            FD_ZERO(&writefd);
            FD_ZERO(&errorfd);

            FD_SET(m_fSock, &writefd);
            FD_SET(m_fSock, &errorfd);

            if (::select(static_cast<int>(m_fSock + 1), nullptr, &writefd, &errorfd, &timeout) == 0)
            {
                if (m_bCloseReq == false) continue;
                break;
            }

            if (FD_ISSET(m_fSock, &errorfd))
            {
                if (m_iError == 0)
                {
                    socklen_t iLen = sizeof(m_iError);
                    getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                    m_iErrLoc = 2;
                    lock.unlock();
                    thread thErrorCb([&]()
                    {
                        if (m_fErrorParam && m_bStop == false)
                            m_fErrorParam(m_pBkRef, m_pvUserData);
                        else if (m_fError && m_bStop == false)
                            m_fError(m_pBkRef);
                    });
                    thErrorCb.join();
                    lock.lock();
                }
                break;
            }

            m_mxOutDeque.lock();
            if (m_quOutData.size() == 0)
            {
                m_atOutBytes = 0;
                m_mxOutDeque.unlock();
                continue;
            }
            DATA data = move(m_quOutData.front());
            m_quOutData.pop_front();
            m_atOutBytes -= BUFLEN(data);
            m_mxOutDeque.unlock();

            const uint32_t transferred = ::send(m_fSock, reinterpret_cast<char*>(&BUFFER(data)[0]), static_cast<int>(BUFLEN(data)), 0);
            if (static_cast<int32_t>(transferred) <= 0)
            {
                const int iError = WSAGetLastError();
                if (iError != WSAEWOULDBLOCK)
                {
                    m_iError = iError;
                    m_iErrLoc = 3;
                    lock.unlock();
                    thread thErrorCb([&]()
                    {
                        if (m_fErrorParam && m_bStop == false)
                            m_fErrorParam(m_pBkRef, m_pvUserData);
                        else if (m_fError && m_bStop == false)
                            m_fError(m_pBkRef);
                    });
                    thErrorCb.join();
                    lock.lock();
                    break;
                }
                // Put the not send bytes back into the que if it is not a SSL connection. A SSL connection has the bytes still available
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data));
                copy_n(&BUFFER(data)[0], BUFLEN(data), &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += BUFLEN(data);
                m_quOutData.emplace_front(move(tmp), BUFLEN(data));
                m_mxOutDeque.unlock();
            }
            else if (transferred < BUFLEN(data)) // Less bytes send as buffer size, we put the rast back in your que
            {
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data) - transferred);
                copy_n(&BUFFER(data)[transferred], BUFLEN(data) - transferred, &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += (BUFLEN(data) - transferred);
                m_quOutData.emplace_front(move(tmp), (BUFLEN(data) - transferred));
                m_mxOutDeque.unlock();
            }
        }

        if (m_iError != 0)
            break;
    }

    lock.unlock();

    // if we get out of the while loop, the stop request was send or we have an error
    if (m_iError == 0 && m_fSock != INVALID_SOCKET)
    {
        if (::shutdown(m_fSock, SD_SEND) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
            m_iErrLoc = 4;
        }
    }
    m_iShutDownState |= 2;

    unsigned char cExpected = 7;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
        {
            ::closesocket(m_fSock);
            m_fSock = INVALID_SOCKET;
        }
        StartClosingCB();

        if (m_pRefServSocket != nullptr || m_bSelfDelete == true)    // Auto-delete, socket created from server socket
            Delete();// thread([&]() { delete this; }).detach();
    }
}